

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_array_copy
          (CompilerGLSL *this,string *lhs,uint32_t param_2,uint32_t rhs_id,StorageClass param_4,
          StorageClass param_5)

{
  undefined1 local_48 [40];
  StorageClass param_5_local;
  StorageClass param_4_local;
  uint32_t rhs_id_local;
  uint32_t param_2_local;
  string *lhs_local;
  CompilerGLSL *this_local;
  
  local_48._32_4_ = param_5;
  local_48._36_4_ = param_4;
  param_5_local = rhs_id;
  param_4_local = param_2;
  _rhs_id_local = lhs;
  lhs_local = (string *)this;
  to_expression_abi_cxx11_((CompilerGLSL *)local_48,(uint32_t)this,SUB41(rhs_id,0));
  statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,lhs,(char (*) [4])0x5cb349,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [2])0x5b3b6f);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void CompilerGLSL::emit_array_copy(const string &lhs, uint32_t, uint32_t rhs_id, StorageClass, StorageClass)
{
	statement(lhs, " = ", to_expression(rhs_id), ";");
}